

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intraprocess_subscriber_link.cpp
# Opt level: O0

void __thiscall miniros::IntraProcessSubscriberLink::drop(IntraProcessSubscriberLink *this)

{
  element_type *peVar1;
  undefined8 uVar2;
  string *in_RDI;
  bool bVar3;
  bool enabled;
  PublicationPtr parent;
  scoped_lock<std::recursive_mutex> lock;
  char *in_stack_ffffffffffffff58;
  LogLocation *in_stack_ffffffffffffff60;
  weak_ptr<miniros::Publication> *in_stack_ffffffffffffff68;
  LogLocation *in_stack_ffffffffffffff70;
  void *logger_handle;
  Level LVar4;
  LogLocation *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  allocator<char> in_stack_ffffffffffffffa7;
  string local_58 [48];
  __shared_ptr local_28 [16];
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar5;
  Publication *in_stack_fffffffffffffff0;
  
  std::scoped_lock<std::recursive_mutex>::scoped_lock
            ((scoped_lock<std::recursive_mutex> *)in_stack_ffffffffffffff60,
             (mutex_type *)in_stack_ffffffffffffff58);
  bVar3 = (in_RDI[4].field_2._M_local_buf[8] & 1U) == 0;
  if (bVar3) {
    in_RDI[4].field_2._M_local_buf[8] = '\x01';
  }
  uVar5 = (uint)!bVar3;
  std::scoped_lock<std::recursive_mutex>::~scoped_lock
            ((scoped_lock<std::recursive_mutex> *)0x451e5f);
  if (uVar5 == 0) {
    bVar3 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI[4]._M_string_length);
    if (bVar3) {
      peVar1 = std::
               __shared_ptr_access<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x451e99);
      (*(peVar1->super_PublisherLink)._vptr_PublisherLink[5])();
      std::__shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<miniros::IntraProcessPublisherLink,_(__gnu_cxx::_Lock_policy)2> *)
                 in_stack_ffffffffffffff70);
    }
    std::weak_ptr<miniros::Publication>::lock(in_stack_ffffffffffffff68);
    bVar3 = std::__shared_ptr::operator_cast_to_bool(local_28);
    if (bVar3) {
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((drop::loc.initialized_ ^ 0xffU) & 1) != 0) {
        LVar4 = (Level)((ulong)&stack0xffffffffffffffa7 >> 0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffffa7,
                            CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)),
                   in_stack_ffffffffffffff98,(allocator<char> *)in_stack_ffffffffffffff90);
        console::initializeLogLocation(in_stack_ffffffffffffff90,in_RDI,LVar4);
        std::__cxx11::string::~string(local_58);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
      }
      if (drop::loc.level_ != Debug) {
        console::setLogLocationLevel
                  (in_stack_ffffffffffffff60,(Level)((ulong)in_stack_ffffffffffffff58 >> 0x20));
        console::checkLogLocationEnabled(in_stack_ffffffffffffff70);
      }
      LVar4 = drop::loc.level_;
      if ((drop::loc.logger_enabled_ & 1U) != 0) {
        logger_handle = drop::loc.logger_;
        uVar2 = std::__cxx11::string::c_str();
        in_stack_ffffffffffffff58 = "Connection to local subscriber on topic [%s] dropped";
        console::print((FilterBase *)0x0,logger_handle,(Level)(ulong)LVar4,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/intraprocess_subscriber_link.cpp"
                       ,0x73,"virtual void miniros::IntraProcessSubscriberLink::drop()",
                       "Connection to local subscriber on topic [%s] dropped",uVar2);
      }
      std::__shared_ptr_access<miniros::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::Publication,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x452072);
      std::enable_shared_from_this<miniros::SubscriberLink>::shared_from_this
                ((enable_shared_from_this<miniros::SubscriberLink> *)in_stack_ffffffffffffff58);
      Publication::removeSubscriberLink
                (in_stack_fffffffffffffff0,
                 (SubscriberLinkPtr *)CONCAT44(uVar5,in_stack_ffffffffffffffe8));
      std::shared_ptr<miniros::SubscriberLink>::~shared_ptr
                ((shared_ptr<miniros::SubscriberLink> *)0x4520a7);
    }
    std::shared_ptr<miniros::Publication>::~shared_ptr((shared_ptr<miniros::Publication> *)0x4520d0)
    ;
  }
  return;
}

Assistant:

void IntraProcessSubscriberLink::drop()
{
  {
    std::scoped_lock<std::recursive_mutex> lock(drop_mutex_);
    if (dropped_)
    {
      return;
    }

    dropped_ = true;
  }

  if (subscriber_)
  {
    subscriber_->drop();
    subscriber_.reset();
  }

  if (PublicationPtr parent = parent_.lock())
  {
    MINIROS_DEBUG("Connection to local subscriber on topic [%s] dropped", topic_.c_str());

    parent->removeSubscriberLink(shared_from_this());
  }
}